

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O1

_Bool gravity_value_isobject(gravity_value_t v)

{
  bool bVar1;
  bool bVar2;
  gravity_class_t *pgVar3;
  
  pgVar3 = v.isa;
  bVar1 = false;
  bVar2 = false;
  if ((((pgVar3 != (gravity_class_t *)0x0) && (bVar2 = bVar1, gravity_class_int != pgVar3)) &&
      (gravity_class_float != pgVar3)) && (gravity_class_bool != pgVar3)) {
    if (v.field_1.n == 0 || gravity_class_null == pgVar3) {
      bVar2 = false;
    }
    else {
      bVar2 = gravity_class_upvalue == pgVar3 ||
              ((gravity_class_range == pgVar3 ||
               (gravity_class_map == pgVar3 ||
               (gravity_class_list == pgVar3 || gravity_class_module == pgVar3))) ||
              ((gravity_class_instance == pgVar3 ||
               (gravity_class_class == pgVar3 || gravity_class_fiber == pgVar3)) ||
              ((gravity_class_closure == pgVar3 || gravity_class_function == pgVar3) ||
              (gravity_class_object == pgVar3 || gravity_class_string == pgVar3))));
    }
  }
  return bVar2;
}

Assistant:

bool gravity_value_isobject (gravity_value_t v) {
    // was:
    // if (VALUE_ISA_NOTVALID(v)) return false;
    // if (VALUE_ISA_INT(v)) return false;
    // if (VALUE_ISA_FLOAT(v)) return false;
    // if (VALUE_ISA_BOOL(v)) return false;
    // if (VALUE_ISA_NULL(v)) return false;
    // if (VALUE_ISA_UNDEFINED(v)) return false;
    // return true;

    if ((v.isa == NULL) || (v.isa == gravity_class_int) || (v.isa == gravity_class_float) ||
        (v.isa == gravity_class_bool) || (v.isa == gravity_class_null) || (v.p == NULL)) return false;
    
    // extra check to allow ONLY known objects
    if ((v.isa == gravity_class_string) || (v.isa == gravity_class_object) || (v.isa == gravity_class_function) ||
        (v.isa == gravity_class_closure) || (v.isa == gravity_class_fiber) || (v.isa == gravity_class_class) ||
        (v.isa == gravity_class_instance) || (v.isa == gravity_class_module) || (v.isa == gravity_class_list) ||
        (v.isa == gravity_class_map) || (v.isa == gravity_class_range) || (v.isa == gravity_class_upvalue)) return true;
    
    return false;
}